

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

void __thiscall
QFontDatabasePrivate::addApplicationFallbackFontFamily
          (QFontDatabasePrivate *this,ExtendedScript script,QString *familyName)

{
  long lVar1;
  bool bVar2;
  iterator *in_RDX;
  QCache<QtFontFallbacksCacheKey,_QList<QString>_> *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  iterator it;
  size_t *in_stack_ffffffffffffff88;
  undefined1 local_58 [24];
  QFontCache *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::find
            ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)in_RDI,
             (ExtendedScript *)in_stack_ffffffffffffff88);
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::end
            ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)in_RDX);
  bVar2 = QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::iterator::operator==
                    (in_RDX,(iterator *)in_RDI);
  if (bVar2) {
    in_stack_ffffffffffffff88 = &(in_RDI->d).size;
    memset(local_58,0,0x18);
    QList<QString>::QList((QList<QString> *)0x746d23);
    iVar3 = QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::insert
                      ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)in_RDI,
                       (ExtendedScript *)in_stack_ffffffffffffff88,(QList<QString> *)0x746d36);
    in_stack_ffffffffffffffc0 = (QFontCache *)iVar3.i.d;
    QList<QString>::~QList((QList<QString> *)0x746d5e);
  }
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::iterator::operator->
            ((iterator *)0x746d68);
  QList<QString>::prepend((QList<QString> *)in_RDI,(parameter_type)in_stack_ffffffffffffff88);
  QFontCache::instance();
  QFontCache::clear(in_stack_ffffffffffffffc0);
  QCache<QtFontFallbacksCacheKey,_QList<QString>_>::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDatabasePrivate::addApplicationFallbackFontFamily(ExtendedScript script, const QString &familyName)
{
    auto it = applicationFallbackFontFamiliesHash.find(script);
    if (it == applicationFallbackFontFamiliesHash.end())
        it = applicationFallbackFontFamiliesHash.insert(script, QStringList{});

    it->prepend(familyName);

    QFontCache::instance()->clear();
    fallbacksCache.clear();
}